

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.cpp
# Opt level: O2

void cppcms::impl::md5_append(md5_state_t *pms,md5_byte_t *data,int nbytes)

{
  uint uVar1;
  md5_word_t mVar2;
  ulong __n;
  uint uVar3;
  size_t __n_00;
  
  if (0 < nbytes) {
    uVar1 = pms->count[0];
    uVar3 = uVar1 >> 3 & 0x3f;
    mVar2 = ((uint)nbytes >> 0x1d) + pms->count[1];
    pms->count[1] = mVar2;
    pms->count[0] = nbytes * 8 + uVar1;
    if (CARRY4(nbytes * 8,uVar1)) {
      pms->count[1] = mVar2 + 1;
    }
    if (uVar3 != 0) {
      __n = (ulong)(0x40 - uVar3);
      if (nbytes + uVar3 < 0x41) {
        __n = (ulong)(uint)nbytes;
      }
      memcpy(pms->buf + uVar3,data,__n);
      if ((int)__n + uVar3 < 0x40) {
        return;
      }
      data = data + __n;
      nbytes = nbytes - (int)__n;
      md5_process(pms,pms->buf);
    }
    for (__n_00 = (size_t)nbytes; 0x3f < (int)__n_00; __n_00 = __n_00 - 0x40) {
      md5_process(pms,data);
      data = data + 0x40;
    }
    if ((int)__n_00 != 0) {
      memcpy(pms->buf,data,__n_00);
      return;
    }
  }
  return;
}

Assistant:

void
md5_append(md5_state_t *pms, const md5_byte_t *data, int nbytes)
{
    const md5_byte_t *p = data;
    int left = nbytes;
    int offset = (pms->count[0] >> 3) & 63;
    md5_word_t nbits = (md5_word_t)(nbytes << 3);

    if (nbytes <= 0)
	return;

    /* Update the message length. */
    pms->count[1] += nbytes >> 29;
    pms->count[0] += nbits;
    if (pms->count[0] < nbits)
	pms->count[1]++;

    /* Process an initial partial block. */
    if (offset) {
	int copy = (offset + nbytes > 64 ? 64 - offset : nbytes);

	memcpy(pms->buf + offset, p, copy);
	if (offset + copy < 64)
	    return;
	p += copy;
	left -= copy;
	md5_process(pms, pms->buf);
    }

    /* Process full blocks. */
    for (; left >= 64; p += 64, left -= 64)
	md5_process(pms, p);

    /* Process a final partial block. */
    if (left)
	memcpy(pms->buf, p, left);
}